

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop-fixture.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  green_loop_t loop;
  undefined8 uStack_20;
  
  fprintf(_stderr,"green include version: \"%s\".\n","0.1.0");
  __stream = _stderr;
  pcVar2 = green_version_string();
  fprintf(__stream,"green library version: \"%s\".\n",pcVar2);
  iVar1 = _green_init(0,1);
  if (iVar1 == 0) {
    loop = green_loop_init();
    if (loop == (green_loop_t)0x0) {
      pcVar2 = "(loop) != (((void*)0))";
      uStack_20 = 0xf;
    }
    else {
      test(loop);
      iVar1 = green_loop_release(loop);
      if (iVar1 == 0) {
        iVar1 = green_term();
        if (iVar1 == 0) {
          return 0;
        }
        pcVar2 = "(green_term()) == (0)";
        uStack_20 = 0x12;
      }
      else {
        pcVar2 = "(green_loop_release(loop)) == (0)";
        uStack_20 = 0x11;
      }
    }
  }
  else {
    pcVar2 = "(_green_init(0, 1)) == (0)";
    uStack_20 = 0xd;
  }
  fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/loop-fixture.c"
          ,uStack_20,pcVar2);
  abort();
}

Assistant:

int main(int argc, char ** argv)
{
    fprintf(stderr, "green include version: \"%s\".\n", GREEN_VERSION_STRING);
    fprintf(stderr,
            "green library version: \"%s\".\n", green_version_string());

    check_eq(green_init(), 0);
    green_loop_t loop = green_loop_init();
    check_ne(loop, NULL);
    check_eq(test(loop), 0);
    check_eq(green_loop_release(loop), 0); loop = NULL;
    check_eq(green_term(), 0);

    return EXIT_SUCCESS;
}